

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

bool selection_is_multiple_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *in_value;
  Am_Value object_modified_value;
  Am_Object command;
  Am_Value_List obj_list;
  Am_Value local_48;
  Am_Object local_38;
  Am_Value_List local_30;
  Am_Object local_20;
  
  Am_Object::Am_Object(&local_20,self);
  get_command_to_undo(&local_38);
  Am_Object::~Am_Object(&local_20);
  bVar1 = Am_Object::Valid(&local_38);
  if (bVar1) {
    local_48.type = 0;
    local_48.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(&local_38,0x16d,5);
    Am_Value::operator=(&local_48,in_value);
    bVar1 = Am_Value_List::Test(&local_48);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_30);
      Am_Value_List::operator=(&local_30,&local_48);
      uVar2 = Am_Value_List::Length(&local_30);
      Am_Value_List::~Am_Value_List(&local_30);
      if (1 < uVar2) {
        Am_Value::~Am_Value(&local_48);
        bVar1 = true;
        goto LAB_002171a0;
      }
    }
    Am_Value::~Am_Value(&local_48);
  }
  bVar1 = false;
LAB_002171a0:
  Am_Object::~Am_Object(&local_38);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, selection_is_multiple)
{
  Am_Object command = get_command_to_undo(self);
  if (command.Valid()) {
    Am_Value object_modified_value;
    object_modified_value = command.Peek(Am_OBJECT_MODIFIED, Am_NO_DEPENDENCY);
    if (Am_Value_List::Test(object_modified_value)) {
      Am_Value_List obj_list;
      obj_list = object_modified_value;
      if (obj_list.Length() > 1)
        return true;
    }
  }
  return false;
}